

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O1

void __thiscall
Diligent::FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(FixedBlockMemoryAllocator *this)

{
  ulong uVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  pointer pvVar4;
  __node_base_ptr p_Var5;
  ulong uVar6;
  __node_base_ptr p_Var7;
  __hash_code __code;
  _Hash_node_base *p_Var8;
  string msg;
  string local_50;
  
  pvVar4 = (this->m_PagePool).
           super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_PagePool).
      super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar4) {
    p_Var8 = (_Hash_node_base *)0x0;
    do {
      if (pvVar4[(long)p_Var8].m_NumFreeBlocks < pvVar4[(long)p_Var8].m_NumInitializedBlocks) {
        FormatString<char[54]>
                  (&local_50,(char (*) [54])"Memory leak detected: memory page has allocated block")
        ;
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"~FixedBlockMemoryAllocator",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
                   ,0xc4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      uVar1 = (this->m_AvailablePages)._M_h._M_bucket_count;
      uVar6 = (ulong)p_Var8 % uVar1;
      p_Var2 = (this->m_AvailablePages)._M_h._M_buckets[uVar6];
      p_Var5 = (__node_base_ptr)0x0;
      if ((p_Var2 != (__node_base_ptr)0x0) &&
         (p_Var5 = p_Var2, p_Var7 = p_Var2->_M_nxt, p_Var8 != p_Var2->_M_nxt[1]._M_nxt)) {
        while (p_Var3 = p_Var7->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
          p_Var5 = (__node_base_ptr)0x0;
          if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar6) ||
             (p_Var5 = p_Var7, p_Var7 = p_Var3, p_Var8 == p_Var3[1]._M_nxt)) goto LAB_0072c78f;
        }
        p_Var5 = (__node_base_ptr)0x0;
      }
LAB_0072c78f:
      if ((p_Var5 == (__node_base_ptr)0x0) || (p_Var5->_M_nxt == (_Hash_node_base *)0x0)) {
        FormatString<char[46]>
                  (&local_50,(char (*) [46])"Memory page is not in the available page pool");
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"~FixedBlockMemoryAllocator",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
                   ,0xc5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      p_Var8 = (_Hash_node_base *)((long)&p_Var8->_M_nxt + 1);
      pvVar4 = (this->m_PagePool).
               super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (p_Var8 < (_Hash_node_base *)
                      ((long)(this->m_PagePool).
                             super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 5));
  }
  std::
  _Hashtable<void_*,_std::pair<void_*const,_unsigned_long>,_Diligent::STDAllocator<std::pair<void_*const,_unsigned_long>,_Diligent::IMemoryAllocator>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->m_AddrToPageId)._M_h);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_Diligent::STDAllocator<unsigned_long,_Diligent::IMemoryAllocator>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->m_AvailablePages)._M_h);
  std::
  vector<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
  ::~vector(&this->m_PagePool);
  return;
}

Assistant:

FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator()
{
#ifdef DILIGENT_DEBUG
    for (size_t p = 0; p < m_PagePool.size(); ++p)
    {
        VERIFY(!m_PagePool[p].HasAllocations(), "Memory leak detected: memory page has allocated block");
        VERIFY(m_AvailablePages.find(p) != m_AvailablePages.end(), "Memory page is not in the available page pool");
    }
#endif
}